

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void __thiscall mocker::ir::FunctionModule::sortBasicBlocks(FunctionModule *this)

{
  long lVar1;
  _List_node_base *p_Var2;
  long lVar3;
  BasicBlockList *this_00;
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *plVar4;
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *plVar5;
  __off64_t *in_R8;
  size_t in_R9;
  list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *__x;
  uint in_stack_fffffffffffff9a8;
  list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> __carry;
  _List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> local_638 [64];
  
  p_Var2 = (this->bbs).
           super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  this_00 = &this->bbs;
  if ((p_Var2 != (_List_node_base *)this_00) && (p_Var2->_M_next != (_List_node_base *)this_00)) {
    __carry.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&__carry;
    __carry.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
    _M_impl._M_node._M_size = 0;
    lVar1 = 0;
    do {
      lVar3 = (long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar1;
      *(long *)((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_prev + lVar1) = lVar3;
      *(long *)lVar3 = lVar3;
      *(undefined8 *)((long)&local_638[0]._M_impl._M_node._M_size + lVar1) = 0;
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x600);
    plVar5 = (list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)local_638;
    __carry.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
    _M_impl._M_node.super__List_node_base._M_prev =
         __carry.super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
         _M_impl._M_node.super__List_node_base._M_next;
    do {
      plVar4 = plVar5;
      std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::splice
                (&__carry,(int)__carry.
                               super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                               ._M_impl._M_node.super__List_node_base._M_next,(__off64_t *)this_00,
                 (int)p_Var2,in_R8,in_R9,in_stack_fffffffffffff9a8);
      for (__x = (list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)local_638;
          __x != plVar4; __x = __x + 0x18) {
        if (__x == *(list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> **)__x) {
          lVar1 = 0;
          plVar5 = __x;
          goto LAB_0018a8d7;
        }
        std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
        merge<mocker::ir::FunctionModule::sortBasicBlocks()::__0>(__x,&__carry);
        std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::swap
                  (&__carry,(list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *
                            )__x);
      }
      lVar1 = 0x18;
      plVar5 = plVar4;
LAB_0018a8d7:
      std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::swap
                (&__carry,(list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                          plVar5);
      p_Var2 = (this_00->
               super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>).
               _M_impl._M_node.super__List_node_base._M_next;
      plVar5 = plVar4 + lVar1;
    } while (p_Var2 != (_List_node_base *)this_00);
    plVar5 = (list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)local_638;
    while (plVar5 = plVar5 + 0x18, plVar5 != plVar4 + lVar1) {
      std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
      merge<mocker::ir::FunctionModule::sortBasicBlocks()::__0>(plVar5);
    }
    plVar5 = plVar4 + -0x18;
    if (__x == plVar4) {
      plVar5 = plVar4;
    }
    std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::swap
              (this_00,(list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
                       plVar5);
    lVar1 = 0x5e8;
    do {
      std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
      _M_clear((_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_> *)
               ((long)&local_638[0]._M_impl._M_node.super__List_node_base._M_next + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
    _M_clear(&__carry.
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>);
  }
  return;
}

Assistant:

void FunctionModule::sortBasicBlocks() {
  bbs.sort([](const BasicBlock &lhs, const BasicBlock &rhs) {
    return lhs.getLabelID() < rhs.getLabelID();
  });
}